

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

_Bool find_any_nearby_injured_kin(chunk *c,monster *mon)

{
  loc_conflict grid_00;
  monster *pmVar1;
  wchar_t local_28;
  wchar_t wStack_24;
  loc_conflict grid;
  monster *mon_local;
  chunk *c_local;
  
  wStack_24 = (mon->grid).y + L'\xfffffffb';
  do {
    if ((mon->grid).y + L'\x05' < wStack_24) {
      return false;
    }
    for (local_28 = (mon->grid).x + L'\xfffffffb'; local_28 <= (mon->grid).x + L'\x05';
        local_28 = local_28 + L'\x01') {
      grid_00.y = wStack_24;
      grid_00.x = local_28;
      pmVar1 = get_injured_kin(c,mon,grid_00);
      if (pmVar1 != (monster *)0x0) {
        return true;
      }
    }
    wStack_24 = wStack_24 + L'\x01';
  } while( true );
}

Assistant:

bool find_any_nearby_injured_kin(struct chunk *c, const struct monster *mon)
{
	struct loc grid;
	for (grid.y = mon->grid.y - MAX_KIN_RADIUS;
		 grid.y <= mon->grid.y + MAX_KIN_RADIUS; grid.y++) {
		for (grid.x = mon->grid.x - MAX_KIN_RADIUS;
			 grid.x <= mon->grid.x + MAX_KIN_RADIUS; grid.x++) {
			if (get_injured_kin(c, mon, grid) != NULL) {
				return true;
			}
		}
	}

	return false;
}